

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_sig.c
# Opt level: O2

err_t cmdSigExtr(char *obj_name,char *sig_name,char *scope)

{
  bool_t bVar1;
  int iVar2;
  err_t eVar3;
  u32 uVar4;
  cmd_sig_t *sig;
  size_t sVar5;
  ulong uVar6;
  size_t sVar7;
  size_t count;
  char *dec;
  ulong uVar8;
  ulong uVar9;
  octet *der;
  size_t sig_len;
  
  bVar1 = strIsValid(sig_name);
  if (bVar1 == 0) {
    return 0x6d;
  }
  bVar1 = strIsValid(obj_name);
  if (bVar1 == 0) {
    return 0x6d;
  }
  bVar1 = strIsValid(scope);
  if (bVar1 == 0) {
    return 0x6d;
  }
  iVar2 = strCmp(scope,"body");
  if (((iVar2 != 0) && (iVar2 = strCmp(scope,"sig"), iVar2 != 0)) &&
     (bVar1 = strStartsWith(scope,"cert"), bVar1 == 0)) {
    return 0x25b;
  }
  sig = (cmd_sig_t *)blobCreate(0x630);
  if (sig == (cmd_sig_t *)0x0) {
    return 0x6e;
  }
  eVar3 = cmdSigRead(sig,&sig_len,sig_name);
  if (eVar3 != 0) goto LAB_00106da8;
  bVar1 = strStartsWith(scope,"cert");
  if (bVar1 != 0) {
    sVar5 = strLen("cert");
    dec = scope + sVar5;
    bVar1 = decIsValid(dec);
    eVar3 = 0x25b;
    if ((bVar1 != 0) && (sVar5 = strLen(dec), sVar5 == 1)) {
      uVar4 = decToU32(dec);
      uVar6 = (ulong)uVar4;
      sVar5 = sig->certs_len;
      der = sig->certs;
      sVar7 = 0;
      for (uVar8 = 0;
          ((count = sVar7, uVar9 = uVar8, sVar5 != 0 &&
           (sVar7 = btokCVCLen(der,sVar5), count = 0xffffffffffffffff, sVar7 != 0xffffffffffffffff))
          && (count = sVar7, uVar9 = uVar6, uVar6 != uVar8)); uVar8 = uVar8 + 1) {
        sVar5 = sVar5 - sVar7;
        der = der + sVar7;
      }
      eVar3 = 0x202;
      if ((uVar9 == uVar6) && (count - 1 < 0xfffffffffffffffe)) {
        eVar3 = cmdFileWrite(obj_name,der,count);
      }
    }
    goto LAB_00106da8;
  }
  iVar2 = strCmp(scope,"body");
  sVar5 = cmdFileSize(sig_name);
  if (iVar2 == 0) {
    if (sVar5 == 0xffffffffffffffff) goto LAB_00106ecf;
    eVar3 = 0x132;
    sig_len = sVar5 - sig_len;
    if (sig_len == 0) goto LAB_00106da8;
    sVar5 = 0;
  }
  else {
    if (sVar5 == 0xffffffffffffffff) {
LAB_00106ecf:
      eVar3 = 0xcf;
      goto LAB_00106da8;
    }
    sVar5 = sVar5 - sig_len;
  }
  eVar3 = cmdFileDup(obj_name,sig_name,sVar5,sig_len);
LAB_00106da8:
  blobClose(sig);
  return eVar3;
}

Assistant:

err_t cmdSigExtr(const char* obj_name, const char* sig_name, const char* scope)
{
	err_t code;
	void* stack;
	cmd_sig_t* sig;
	size_t sig_len;
	// входной контроль
	if (!strIsValid(sig_name) || !strIsValid(obj_name) || !strIsValid(scope))
		return ERR_BAD_INPUT;
	if (!strEq(scope, "body") &&
		!strEq(scope, "sig") &&
		!strStartsWith(scope, "cert"))
		return ERR_CMD_PARAMS;
	// выделить и разметить память
	code = cmdBlobCreate(stack, sizeof(cmd_sig_t));
	ERR_CALL_CHECK(code);
	sig = (cmd_sig_t*)stack;
	// читать подпись
	code = cmdSigRead(sig, &sig_len, sig_name);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// извлечь сертификат?
	if (strStartsWith(scope, "cert"))
	{
		size_t num;
		size_t certs_len;
		const octet* cert;
		size_t cert_len;
		size_t pos;
		// определить номер сертификата
		scope += strLen("cert");
		if (!decIsValid(scope) || strLen(scope) != 1)
			code = ERR_CMD_PARAMS;
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		num = decToU32(scope);
		// искать сертификат
		certs_len = sig->certs_len, cert = sig->certs, cert_len = pos = 0;
		while (certs_len)
		{
			cert_len = btokCVCLen(cert, certs_len);
			if (cert_len == SIZE_MAX || pos == num)
				break;
			certs_len -= cert_len, cert += cert_len, ++pos;
		}
		// найден? записать в файл
		if (pos == num && cert_len != 0 && cert_len != SIZE_MAX)
			code = cmdFileWrite(obj_name, cert, cert_len);
		else
			code = ERR_BAD_CERT;
	}
	else if (strEq(scope, "body"))
	{
		size_t size = cmdFileSize(sig_name);
		if (size == SIZE_MAX)
			code = ERR_FILE_READ;
		else if (size == sig_len)
			code = ERR_BAD_FORMAT;
		else
			code = cmdFileDup(obj_name, sig_name, 0, size - sig_len);
	}
	else
	{
		size_t size = cmdFileSize(sig_name);
		if (size == SIZE_MAX)
			code = ERR_FILE_READ;
		else
			code = cmdFileDup(obj_name, sig_name, size - sig_len, sig_len);
	}
	// завершить
	cmdBlobClose(stack);
	return code;
}